

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

string * google::protobuf::compiler::python::anon_unknown_0::
         NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *descriptor,string *separator)

{
  long lVar1;
  string *extraout_RAX;
  long *plVar2;
  string *extraout_RAX_00;
  string *psVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  plVar2 = *(long **)descriptor;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar1 = *plVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar1,plVar2[1] + lVar1);
  puVar5 = *(undefined8 **)(descriptor + 0x18);
  psVar3 = extraout_RAX;
  if (puVar5 != (undefined8 *)0x0) {
    do {
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar5,
                     separator);
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_50,
                                  (ulong)(__return_storage_ptr__->_M_dataplus)._M_p);
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = plVar2[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*plVar2;
      }
      local_68 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      psVar3 = (string *)&local_50.field_2;
      if ((string *)local_50._M_dataplus._M_p != psVar3) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        psVar3 = extraout_RAX_00;
      }
      puVar5 = (undefined8 *)puVar5[3];
    } while (puVar5 != (undefined8 *)0x0);
  }
  return psVar3;
}

Assistant:

string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                   const string& separator) {
  string name = descriptor.name();
  for (const Descriptor* current = descriptor.containing_type();
       current != NULL; current = current->containing_type()) {
    name = current->name() + separator + name;
  }
  return name;
}